

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256Cbc
          (ByteData *__return_storage_ptr__,ByteData *key,ByteData *iv,ByteData *data)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  uchar *key_00;
  size_type key_len;
  uchar *iv_00;
  size_type iv_len;
  uchar *bytes;
  uchar *bytes_out;
  size_type len;
  string *in_stack_fffffffffffffdd0;
  string *message;
  size_type in_stack_fffffffffffffdd8;
  CfdError CVar5;
  CfdException *in_stack_fffffffffffffde0;
  CfdException *this;
  undefined1 local_179 [33];
  CfdSourceLocation local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  int local_124;
  undefined1 auStack_120 [4];
  int ret;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  size_t data_size;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  ByteData *local_30;
  ByteData *data_local;
  ByteData *iv_local;
  ByteData *key_local;
  
  local_30 = data;
  data_local = iv;
  iv_local = key;
  key_local = __return_storage_ptr__;
  sVar3 = ByteData::GetDataSize(key);
  if (sVar3 != 0x20) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    CVar5 = (CfdError)(in_stack_fffffffffffffdd8 >> 0x20);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x29e;
    local_48.funcname = "EncryptAes256Cbc";
    logger::warn<>(&local_48,"wally_aes key size NG.");
    local_7d = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"EncryptAes256Cbc key size error.",&local_69);
    CfdException::CfdException(in_stack_fffffffffffffde0,CVar5,in_stack_fffffffffffffdd0);
    local_7d = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(local_30);
  if (!bVar1) {
    sVar3 = ByteData::GetDataSize(local_30);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)((sVar3 & 0xfffffffffffffff0) + 0x10);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ef07a);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8,(allocator_type *)in_stack_fffffffffffffdd0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ef0a2);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,iv_local);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written,data_local)
    ;
    auStack_120[0] = (_Alloc_hider)0x0;
    stack0xfffffffffffffee1 = 0;
    key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef0e4);
    key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    iv_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef111);
    iv_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
    ByteData::GetBytes(&local_140,local_30);
    bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef149);
    sVar3 = ByteData::GetDataSize(local_30);
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef175);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    message = (string *)auStack_120;
    iVar2 = wally_aes_cbc(key_00,key_len,iv_00,iv_len,bytes,sVar3,1,bytes_out,len,(size_t *)message)
    ;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    local_124 = iVar2;
    if (iVar2 != 0) {
      local_158.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_158.filename = local_158.filename + 1;
      local_158.line = 0x2b6;
      local_158.funcname = "EncryptAes256Cbc";
      logger::warn<int&>(&local_158,"wally_aes_cbc NG[{}].",&local_124);
      uVar4 = __cxa_allocate_exception(0x30);
      this = (CfdException *)local_179;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_179 + 1),"EncryptAes256Cbc error.",(allocator *)this);
      CfdException::CfdException(this,(CfdError)((ulong)uVar4 >> 0x20),message);
      __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return __return_storage_ptr__;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  CVar5 = (CfdError)(in_stack_fffffffffffffdd8 >> 0x20);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x2a4;
  local_98.funcname = "EncryptAes256Cbc";
  logger::warn<>(&local_98,"wally_aes data is Empty.");
  data_size._6_1_ = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_b8,"EncryptAes256Cbc data isEmpty.",(allocator *)((long)&data_size + 7));
  CfdException::CfdException(in_stack_fffffffffffffde0,CVar5,in_stack_fffffffffffffdd0);
  data_size._6_1_ = 0;
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256Cbc(
    const ByteData &key, const ByteData &iv, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size =
      (((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength);
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> iv_data = iv.GetBytes();
  size_t written = 0;

  // Encrypt data using AES(CBC mode, PKCS#7 padding).
  int ret = wally_aes_cbc(
      key_data.data(), key_data.size(), iv_data.data(), iv_data.size(),
      data.GetBytes().data(), data.GetDataSize(), AES_FLAG_ENCRYPT,
      output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes_cbc NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256Cbc error.");
  }

  output.resize(written);
  return ByteData(output);
}